

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O0

QByteArray * QStringAlgorithms<QByteArray>::simplified_helper(QByteArray *str)

{
  long lVar1;
  bool bVar2;
  const_iterator pcVar3;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype newlen;
  bool unmodified;
  Char *ptr;
  Char *dst;
  Char *end;
  Char *src;
  NakedStringType result;
  QByteArray *in_stack_ffffffffffffff68;
  QByteArray *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar5;
  QByteArray *pQVar6;
  qsizetype in_stack_ffffffffffffff90;
  QByteArray *in_stack_ffffffffffffff98;
  char *local_50;
  const_iterator local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  bVar2 = QByteArray::isEmpty((QByteArray *)0x4bdb9d);
  if (bVar2) {
    QByteArray::QByteArray(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    local_38 = QByteArray::cbegin((QByteArray *)0x4bdbc1);
    pcVar3 = QByteArray::cend((QByteArray *)0x4bdbd0);
    bVar2 = QByteArray::isDetached((QByteArray *)0x4bdc09);
    if (bVar2) {
      QByteArray::QByteArray(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    else {
      QByteArray::size(in_RSI);
      QByteArray::QByteArray
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (Initialization)((ulong)pQVar6 >> 0x20));
    }
    local_50 = QByteArray::cbegin((QByteArray *)0x4bdc41);
    while( true ) {
      while( true ) {
        bVar2 = false;
        if (local_38 != pcVar3) {
          in_stack_ffffffffffffff7e = isSpace('\0');
          bVar2 = (bool)in_stack_ffffffffffffff7e;
        }
        if (bVar2 == false) break;
        local_38 = local_38 + 1;
      }
      uVar5 = 0;
      while( true ) {
        bVar4 = 0;
        if (local_38 != pcVar3) {
          in_stack_ffffffffffffff7c = isSpace('\0');
          bVar4 = in_stack_ffffffffffffff7c ^ 0xff;
        }
        if ((bVar4 & 1) == 0) break;
        *local_50 = *local_38;
        local_50 = local_50 + 1;
        local_38 = local_38 + 1;
      }
      if (local_38 == pcVar3) break;
      *local_50 = ' ';
      local_50 = local_50 + 1;
    }
    QByteArray::resize(in_RDI,CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffff7e,
                                                      CONCAT15(bVar4,CONCAT14(
                                                  in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78)))));
    QByteArray::QByteArray(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QByteArray::~QByteArray((QByteArray *)0x4bddc3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }